

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O1

int setDecodeDefaults(jpeg_decompress_struct *dinfo,int pixelFormat,int subsamp,int flags)

{
  long lVar1;
  int iVar2;
  int iVar3;
  J_COLOR_SPACE JVar4;
  jpeg_error_mgr *pjVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  
  dinfo->scale_num = 1;
  dinfo->scale_denom = 1;
  JVar4 = (pixelFormat != 3) + 1 + (uint)(pixelFormat != 3);
  dinfo->comps_in_scan = JVar4;
  dinfo->num_components = JVar4;
  dinfo->jpeg_color_space = JVar4;
  pjVar5 = (jpeg_error_mgr *)(*dinfo->mem->alloc_small)((j_common_ptr)dinfo,1,(long)JVar4 * 0x60);
  dinfo->comp_info = (jpeg_component_info *)pjVar5;
  iVar2 = dinfo->num_components;
  if (0 < (long)iVar2) {
    lVar8 = 0;
    do {
      if (lVar8 == 0) {
        iVar3 = tjMCUWidth[pixelFormat];
        iVar6 = iVar3 + 7;
        if (-1 < iVar3) {
          iVar6 = iVar3;
        }
        *(int *)&pjVar5->emit_message = iVar6 >> 3;
        iVar3 = tjMCUHeight[pixelFormat];
        iVar6 = iVar3 + 7;
        if (-1 < iVar3) {
          iVar6 = iVar3;
        }
        iVar6 = iVar6 >> 3;
      }
      else {
        *(undefined4 *)&pjVar5->emit_message = 1;
        iVar6 = 1;
      }
      *(int *)((long)&pjVar5->emit_message + 4) = iVar6;
      *(int *)((long)&pjVar5->error_exit + 4) = (int)lVar8;
      lVar1 = lVar8 + 1;
      *(int *)&pjVar5->error_exit = (int)lVar1;
      uVar7 = (uint)(lVar8 != 0);
      *(uint *)&pjVar5->format_message = uVar7;
      *(uint *)((long)&pjVar5->output_message + 4) = uVar7;
      *(uint *)&pjVar5->output_message = uVar7;
      dinfo->cur_comp_info[lVar8] = (jpeg_component_info *)pjVar5;
      pjVar5 = (jpeg_error_mgr *)((pjVar5->msg_parm).i + 0xd);
      lVar8 = lVar1;
    } while (iVar2 != lVar1);
  }
  dinfo->data_precision = 8;
  lVar8 = 0x19;
  do {
    if ((&dinfo->err)[lVar8] == (jpeg_error_mgr *)0x0) {
      pjVar5 = (jpeg_error_mgr *)jpeg_alloc_quant_table((j_common_ptr)dinfo);
      (&dinfo->err)[lVar8] = pjVar5;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 == 0x1a);
  return (int)pjVar5;
}

Assistant:

static int setDecodeDefaults(struct jpeg_decompress_struct *dinfo,
                             int pixelFormat, int subsamp, int flags)
{
  int i;

  dinfo->scale_num = dinfo->scale_denom = 1;

  if (subsamp == TJSAMP_GRAY) {
    dinfo->num_components = dinfo->comps_in_scan = 1;
    dinfo->jpeg_color_space = JCS_GRAYSCALE;
  } else {
    dinfo->num_components = dinfo->comps_in_scan = 3;
    dinfo->jpeg_color_space = JCS_YCbCr;
  }

  dinfo->comp_info = (jpeg_component_info *)
    (*dinfo->mem->alloc_small) ((j_common_ptr)dinfo, JPOOL_IMAGE,
                                dinfo->num_components *
                                sizeof(jpeg_component_info));

  for (i = 0; i < dinfo->num_components; i++) {
    jpeg_component_info *compptr = &dinfo->comp_info[i];

    compptr->h_samp_factor = (i == 0) ? tjMCUWidth[subsamp] / 8 : 1;
    compptr->v_samp_factor = (i == 0) ? tjMCUHeight[subsamp] / 8 : 1;
    compptr->component_index = i;
    compptr->component_id = i + 1;
    compptr->quant_tbl_no = compptr->dc_tbl_no =
      compptr->ac_tbl_no = (i == 0) ? 0 : 1;
    dinfo->cur_comp_info[i] = compptr;
  }
  dinfo->data_precision = 8;
  for (i = 0; i < 2; i++) {
    if (dinfo->quant_tbl_ptrs[i] == NULL)
      dinfo->quant_tbl_ptrs[i] = jpeg_alloc_quant_table((j_common_ptr)dinfo);
  }

  return 0;
}